

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_data.h
# Opt level: O3

void __thiscall BindData::BindData(BindData *this,string *inside,string *outside,int flags)

{
  pointer pcVar1;
  size_type sVar2;
  ContextManager *pCVar3;
  size_type sVar4;
  string local_50;
  
  memset(this,0,0x1009);
  memset(&this->outside_,0,0x1009);
  if (0x1000 < inside->_M_string_length) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_50,"bind inside path is larger that maximum (%zi > %zi)",
                      inside->_M_string_length,0x1000);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x1000 < outside->_M_string_length) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_50,"bind outsize path is larger that maximum (%zi > %zi)",
                      outside->_M_string_length,0x1000);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar1 = (inside->_M_dataplus)._M_p;
  sVar2 = inside->_M_string_length;
  (this->inside_).size_ = sVar2;
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      (this->inside_).data_[sVar4] = pcVar1[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  (this->inside_).data_[sVar2] = '\0';
  pcVar1 = (outside->_M_dataplus)._M_p;
  sVar2 = outside->_M_string_length;
  (this->outside_).size_ = sVar2;
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      (this->outside_).data_[sVar4] = pcVar1[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  (this->outside_).data_[sVar2] = '\0';
  this->flags_ = flags;
  return;
}

Assistant:

BindData(const std::string &inside, const std::string &outside, int flags) {
        if (inside.size() > inside_.max_size()) {
            die(format("bind inside path is larger that maximum (%zi > %zi)", inside.size(), inside_.max_size()));
        }
        if (outside.size() > outside_.max_size()) {
            die(format("bind outsize path is larger that maximum (%zi > %zi)", outside.size(), outside_.max_size()));
        }
        inside_ = inside;
        outside_ = outside;
        flags_ = flags;
    }